

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodings.h
# Opt level: O0

bool rapidjson::UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
               (GenericStringStream<rapidjson::UTF8<char>_> *is,uint *codepoint)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool result;
  uchar type;
  Ch c;
  uint *codepoint_local;
  GenericStringStream<rapidjson::UTF8<char>_> *is_local;
  
  bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
  if (((int)(char)bVar1 & 0x80U) == 0) {
    *codepoint = (uint)bVar1;
    is_local._7_1_ = true;
  }
  else {
    bVar2 = GetRange(bVar1);
    if (bVar2 < 0x20) {
      *codepoint = 0xffU >> (bVar2 & 0x1f) & (uint)bVar1;
    }
    else {
      *codepoint = 0;
    }
    switch(bVar2) {
    case 2:
      bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar1 & 0x3f;
      bVar1 = GetRange(bVar1);
      is_local._7_1_ = (bVar1 & 0x70) != 0;
      break;
    case 3:
      bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar1 & 0x3f;
      bVar1 = GetRange(bVar1);
      bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar2 & 0x3f;
      bVar2 = GetRange(bVar2);
      is_local._7_1_ = (bVar1 & 0x70) != 0 && (bVar2 & 0x70) != 0;
      break;
    case 4:
      bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar1 & 0x3f;
      bVar1 = GetRange(bVar1);
      bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar2 & 0x3f;
      bVar2 = GetRange(bVar2);
      is_local._7_1_ = (bVar1 & 0x50) != 0 && (bVar2 & 0x70) != 0;
      break;
    case 5:
      bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar1 & 0x3f;
      bVar1 = GetRange(bVar1);
      bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar2 & 0x3f;
      bVar2 = GetRange(bVar2);
      bVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar3 & 0x3f;
      bVar3 = GetRange(bVar3);
      is_local._7_1_ = ((bVar1 & 0x10) != 0 && (bVar2 & 0x70) != 0) && (bVar3 & 0x70) != 0;
      break;
    case 6:
      bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar1 & 0x3f;
      bVar1 = GetRange(bVar1);
      bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar2 & 0x3f;
      bVar2 = GetRange(bVar2);
      bVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar3 & 0x3f;
      bVar3 = GetRange(bVar3);
      is_local._7_1_ = ((bVar1 & 0x70) != 0 && (bVar2 & 0x70) != 0) && (bVar3 & 0x70) != 0;
      break;
    default:
      is_local._7_1_ = false;
      break;
    case 10:
      bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar1 & 0x3f;
      bVar1 = GetRange(bVar1);
      bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar2 & 0x3f;
      bVar2 = GetRange(bVar2);
      is_local._7_1_ = (bVar1 & 0x20) != 0 && (bVar2 & 0x70) != 0;
      break;
    case 0xb:
      bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar1 & 0x3f;
      bVar1 = GetRange(bVar1);
      bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar2 & 0x3f;
      bVar2 = GetRange(bVar2);
      bVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
      *codepoint = *codepoint << 6 | bVar3 & 0x3f;
      bVar3 = GetRange(bVar3);
      is_local._7_1_ = ((bVar1 & 0x60) != 0 && (bVar2 & 0x70) != 0) && (bVar3 & 0x70) != 0;
    }
  }
  return is_local._7_1_;
}

Assistant:

static bool Decode(InputStream& is, unsigned* codepoint) {
#define RAPIDJSON_COPY() c = is.Take(); *codepoint = (*codepoint << 6) | (static_cast<unsigned char>(c) & 0x3Fu)
#define RAPIDJSON_TRANS(mask) result &= ((GetRange(static_cast<unsigned char>(c)) & mask) != 0)
#define RAPIDJSON_TAIL() RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x70)
        typename InputStream::Ch c = is.Take();
        if (!(c & 0x80)) {
            *codepoint = static_cast<unsigned char>(c);
            return true;
        }

        unsigned char type = GetRange(static_cast<unsigned char>(c));
        if (type >= 32) {
            *codepoint = 0;
        } else {
            *codepoint = (0xFFu >> type) & static_cast<unsigned char>(c);
        }
        bool result = true;
        switch (type) {
        case 2: RAPIDJSON_TAIL(); return result;
        case 3: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 4: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x50); RAPIDJSON_TAIL(); return result;
        case 5: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x10); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 6: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 10: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x20); RAPIDJSON_TAIL(); return result;
        case 11: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x60); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        default: return false;
        }
#undef RAPIDJSON_COPY
#undef RAPIDJSON_TRANS
#undef RAPIDJSON_TAIL
    }